

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mthrowu.c
# Opt level: O1

boolean linedup(xchar ax,xchar ay,xchar bx,xchar by)

{
  boolean bVar1;
  int iVar2;
  undefined7 in_register_00000009;
  undefined7 in_register_00000011;
  undefined7 in_register_00000031;
  undefined7 in_register_00000039;
  
  tbx = ax - bx;
  tby = ay - by;
  if ((ay != by || ax != bx) &&
     (((ax == bx || ay == by ||
       ((schar)((tbx ^ tbx >> 7) - (tbx >> 7)) == (schar)((tby ^ tby >> 7) - (tby >> 7)))) &&
      (iVar2 = distmin((int)tbx,(int)tby,0,0), iVar2 < 8)))) {
    if ((u.ux == ax) && (u.uy == ay)) {
      return viz_array[by][bx] & 1;
    }
    bVar1 = clear_path((int)CONCAT71(in_register_00000039,ax),(int)CONCAT71(in_register_00000031,ay)
                       ,(int)CONCAT71(in_register_00000011,bx),
                       (int)CONCAT71(in_register_00000009,by));
    if (bVar1 != '\0') {
      return '\x01';
    }
  }
  return '\0';
}

Assistant:

boolean linedup(xchar ax, xchar ay, xchar bx, xchar by)
{
	tbx = ax - bx;	/* These two values are set for use */
	tby = ay - by;	/* after successful return.	    */

	/* sometimes displacement makes a monster think that you're at its
	   own location; prevent it from throwing and zapping in that case */
	if (!tbx && !tby) return FALSE;

	if ((!tbx || !tby || abs(tbx) == abs(tby)) /* straight line or diagonal */
	   && distmin(tbx, tby, 0, 0) < BOLT_LIM) {
	    if (ax == u.ux && ay == u.uy) return (boolean)(couldsee(bx,by));
	    else if (clear_path(ax,ay,bx,by)) return TRUE;
	}
	return FALSE;
}